

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::make_string<char_const(&)[14],char*&,char_const(&)[23]>
          (string *__return_storage_ptr__,util *this,char (*args) [14],char **args_1,
          char (*args_2) [23])

{
  ostringstream ss;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,(char *)this);
  std::operator<<((ostream *)local_1a0,*(char **)*args);
  std::operator<<((ostream *)local_1a0,(char *)args_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}